

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

void __thiscall tinygltf::AudioEmitter::AudioEmitter(AudioEmitter *this,AudioEmitter *param_1)

{
  bool bVar1;
  
  std::__cxx11::string::string((string *)this,(string *)param_1);
  bVar1 = param_1->playing;
  this->loop = param_1->loop;
  this->playing = bVar1;
  this->gain = param_1->gain;
  std::__cxx11::string::string((string *)&this->type,(string *)&param_1->type);
  std::__cxx11::string::string((string *)&this->distanceModel,(string *)&param_1->distanceModel);
  PositionalEmitter::PositionalEmitter(&this->positional,&param_1->positional);
  this->source = param_1->source;
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->extensions)._M_t._M_impl.super__Rb_tree_header,
             &(param_1->extensions)._M_t._M_impl.super__Rb_tree_header);
  Value::Value(&this->extras,&param_1->extras);
  std::__cxx11::string::string
            ((string *)&this->extras_json_string,(string *)&param_1->extras_json_string);
  std::__cxx11::string::string
            ((string *)&this->extensions_json_string,(string *)&param_1->extensions_json_string);
  return;
}

Assistant:

AudioEmitter() : type("global"), distanceModel("inverse") {}